

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O1

int __thiscall
FTGATexture::CopyTrueColorPixels
          (FTGATexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  byte bVar1;
  int iVar2;
  BYTE *buffer;
  ulong uVar3;
  BYTE *pBVar4;
  uint uVar5;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar6;
  undefined4 in_register_00000084;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  _func_int *p_Var10;
  int iVar11;
  long lVar12;
  undefined8 uVar13;
  anon_union_4_2_12391d7c_for_PalEntry_0 aaStackY_20438 [32724];
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  uint local_4a4;
  uint local_4a0;
  WORD w;
  byte local_49a;
  char local_499;
  byte local_498;
  short local_497;
  short local_495;
  byte local_493;
  byte local_48a;
  byte local_489;
  FCopyInfo *local_488;
  undefined8 local_480;
  FBitmap *local_478;
  FWadLump lump;
  PalEntry pe [256];
  
  local_480 = CONCAT44(in_register_00000084,rotate);
  local_4a0 = x;
  local_478 = bmp;
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  FWadLump::Read(&lump,&local_49a,0x12);
  FWadLump::Seek(&lump,(ulong)local_49a,1);
  local_4a4 = y;
  local_488 = inf;
  if (local_499 == '\0') {
    iVar11 = 0;
  }
  else {
    memset(pe,0,0x400);
    iVar2 = (int)local_497;
    iVar11 = 0;
    if ((iVar2 < 0x100) && (iVar11 = 0, iVar2 < local_495 + iVar2)) {
      lVar12 = (long)iVar2;
      iVar11 = 0;
      do {
        if (local_493 - 0xf < 2) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&w,2);
          r = (char)w * '\b';
          g = (byte)(w >> 2) & 0xf8;
          b = (byte)(w >> 7) & 0xf8;
LAB_0063b40b:
          a = 0xff;
        }
        else {
          if (local_493 == 0x18) {
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
            goto LAB_0063b40b;
          }
          if (local_493 == 0x20) {
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
            (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&a,1);
            if ((local_489 & 0xf) != 8) goto LAB_0063b40b;
            if ((byte)(a - 1) < 0xfe) {
              iVar11 = 1;
            }
          }
          else {
            a = '\0';
            b = '\0';
            g = '\0';
            r = '\0';
          }
        }
        pe[lVar12].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             ((uint)g << 8 | (uint)r << 0x10 | (uint)a << 0x18 | (uint)b);
      } while ((lVar12 < 0xff) && (lVar12 = lVar12 + 1, lVar12 < (long)local_495 + (long)local_497))
      ;
    }
  }
  bVar1 = local_48a >> 3;
  uVar3 = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width *
                 (uint)bVar1);
  buffer = (BYTE *)operator_new__(uVar3);
  if (local_498 < 4) {
    FWadLump::Read(&lump,buffer,uVar3);
  }
  else {
    ReadCompressed(this,&lump.super_FileReader,buffer,(uint)bVar1);
  }
  uVar5 = (uint)local_48a;
  uVar3 = (ulong)(local_48a >> 3);
  uVar7 = (ulong)(this->super_FTexture).Width;
  uVar9 = uVar3 * uVar7;
  pBVar4 = buffer;
  if ((local_489 & 0x20) == 0) {
    lVar12 = ((ulong)(this->super_FTexture).Height - 1) * uVar9;
    uVar9 = (ulong)(uint)-(int)uVar9;
    pBVar4 = buffer + lVar12;
  }
  local_498 = local_498 & 7;
  if (local_498 != 1) {
    if (local_498 == 2) {
      uVar13 = 8;
      if (uVar5 - 0xf < 2) {
LAB_0063b5b0:
        uVar8 = (ulong)(this->super_FTexture).Height;
        p_Var10 = local_478->_vptr_FBitmap[2];
      }
      else {
        if (local_48a != 0x20) {
          if (uVar5 != 0x18) goto LAB_0063b5dd;
          uVar13 = 5;
          goto LAB_0063b5b0;
        }
        uVar8 = (ulong)(this->super_FTexture).Height;
        p_Var10 = local_478->_vptr_FBitmap[2];
        uVar13 = 5;
        if ((local_489 & 0xf) == 8) {
          iVar11 = -1;
          (*p_Var10)(local_478,(ulong)local_4a0,(ulong)local_4a4,pBVar4,uVar7,uVar8,uVar3,uVar9,
                     local_480,6,local_488,0,0,0);
          goto LAB_0063b5dd;
        }
      }
      (*p_Var10)(local_478,(ulong)local_4a0,(ulong)local_4a4,pBVar4,uVar7,uVar8,uVar3,uVar9,
                 local_480,uVar13,local_488,0,0,0);
      goto LAB_0063b5dd;
    }
    if (local_498 != 3) goto LAB_0063b5dd;
    if (uVar5 == 0x10) {
      uVar13 = 7;
      goto LAB_0063b5b0;
    }
    if (uVar5 != 8) goto LAB_0063b5dd;
    aVar6.d = 0xff000000;
    lVar12 = 0;
    do {
      pe[lVar12].field_0 = aVar6;
      lVar12 = lVar12 + 1;
      aVar6.field_0 = aVar6.field_0 + 0x10101;
    } while (lVar12 != 0x100);
  }
  (*local_478->_vptr_FBitmap[3])
            (local_478,(ulong)local_4a0,(ulong)local_4a4,pBVar4,uVar7,
             (ulong)(this->super_FTexture).Height,uVar3,uVar9,local_480,pe,local_488);
LAB_0063b5dd:
  operator_delete__(buffer);
  FWadLump::~FWadLump(&lump);
  return iVar11;
}

Assistant:

int FTGATexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * sbuffer;
	int transval = 0;

	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(pe, 0, 256*sizeof(PalEntry));
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				else if (a!=0 && a!=255) transval = true;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			pe[i] = PalEntry(a, r, g, b);
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	sbuffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(sbuffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, sbuffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = sbuffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_RGB555, inf);
			break;
		
		case 24:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGR, inf);
			}
			else
			{
				bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_BGRA, inf);
				transval = -1;
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// gray map
			bmp->CopyPixelData(x, y, ptr, Width, Height, step_x, Pitch, rotate, pe, inf);
			break;
		
		case 16:
			bmp->CopyPixelDataRGB(x, y, ptr, Width, Height, step_x, Pitch, rotate, CF_I16, inf);
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] sbuffer;
	return transval;
}